

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

int coda_product_class_add_named_type(coda_product_class *product_class,coda_type *type)

{
  int iVar1;
  coda_type **__ptr;
  uint uVar2;
  
  iVar1 = coda_hashtable_add_name(product_class->named_type_hash_data,type->name);
  if (iVar1 == 0) {
    uVar2 = product_class->num_named_types;
    __ptr = product_class->named_type;
    if ((uVar2 & 0xf) == 0) {
      __ptr = (coda_type **)realloc(__ptr,(long)(int)uVar2 * 8 + 0x80);
      if (__ptr == (coda_type **)0x0) {
        __assert_fail("new_named_type != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                      ,0x350,
                      "int coda_product_class_add_named_type(coda_product_class *, coda_type *)");
      }
      product_class->named_type = __ptr;
      uVar2 = product_class->num_named_types;
    }
    product_class->num_named_types = uVar2 + 1;
    __ptr[(int)uVar2] = type;
    type->retain_count = type->retain_count + 1;
    iVar1 = 0;
  }
  else {
    coda_set_error(-400,"duplicate named type %s for product class %s",type->name,
                   product_class->name);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int coda_product_class_add_named_type(coda_product_class *product_class, coda_type *type)
{
    if (hashtable_add_name(product_class->named_type_hash_data, type->name) != 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "duplicate named type %s for product class %s", type->name,
                       product_class->name);
        return -1;
    }
    if (product_class->num_named_types % BLOCK_SIZE == 0)
    {
        coda_type **new_named_type;

        new_named_type = realloc(product_class->named_type, (product_class->num_named_types + BLOCK_SIZE) *
                                 sizeof(coda_type *));
        assert(new_named_type != NULL);
        product_class->named_type = new_named_type;
    }
    product_class->num_named_types++;
    product_class->named_type[product_class->num_named_types - 1] = type;
    type->retain_count++;

    return 0;
}